

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O3

Vec_Ptr_t * Cmf_CreateOptions(Vec_Wec_t *vPars)

{
  float fVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *vOpts;
  void **ppvVar3;
  int Argc;
  long lVar4;
  int iVar5;
  char Argv [100] [20];
  char local_808 [2008];
  
  vOpts = (Vec_Ptr_t *)malloc(0x10);
  vOpts->nCap = 100;
  vOpts->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vOpts->pArray = ppvVar3;
  if (0 < vPars->nSize) {
    pVVar2 = vPars->pArray;
    puts("Creating all possible settings to be used by the autotuner:");
    builtin_strncpy(local_808,"autotuner",10);
    Argc = 1;
    if (1 < pVVar2->nSize) {
      lVar4 = 1;
      iVar5 = 1;
      do {
        fVar1 = (float)pVVar2->pArray[lVar4];
        Argc = iVar5 + 1;
        sprintf(local_808 + (long)iVar5 * 0x14,"-%c",(ulong)(uint)pVVar2->pArray[lVar4 + -1]);
        if (0.0 <= fVar1) {
          if ((fVar1 != (float)(int)fVar1) || (NAN(fVar1) || NAN((float)(int)fVar1))) {
            sprintf(local_808 + (long)Argc * 0x14,"%.3f",SUB84((double)fVar1,0));
          }
          else {
            sprintf(local_808 + (long)Argc * 0x14,"%d",(ulong)(uint)(int)fVar1);
          }
          Argc = iVar5 + 2;
        }
        lVar4 = lVar4 + 2;
        iVar5 = Argc;
      } while ((int)lVar4 < pVVar2->nSize);
    }
    Cmf_CreateOptions_rec(vPars,1,(char (*) [20])local_808,Argc,vOpts);
    printf("Finished creating %d settings.\n\n",(ulong)(uint)(vOpts->nSize / 2));
    return vOpts;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

Vec_Ptr_t * Cmf_CreateOptions( Vec_Wec_t * vPars )
{
    char Argv[CMD_AUTO_ARG_MAX][20];
    int Symb, Num, i, Argc = 0;
    Vec_Ptr_t * vOpts = Vec_PtrAlloc( 100 );
    Vec_Int_t * vLine = Vec_WecEntry( vPars, 0 );
    printf( "Creating all possible settings to be used by the autotuner:\n" );
    sprintf( Argv[Argc++], "autotuner" );
    Vec_IntForEachEntryDouble( vLine, Symb, Num, i )
    {
        float NumF = Abc_Int2Float(Num);
        sprintf( Argv[Argc++], "-%c", Symb );
        if ( NumF < 0.0 )
            continue;
        if ( NumF == (float)(int)NumF )
            sprintf( Argv[Argc++], "%d", (int)NumF );
        else
            sprintf( Argv[Argc++], "%.3f", NumF );
    }
    Cmf_CreateOptions_rec( vPars, 1, Argv, Argc, vOpts );
    printf( "Finished creating %d settings.\n\n", Vec_PtrSize(vOpts)/2 );
    return vOpts;
}